

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinImporter::ReadBinaryNode
          (AssbinImporter *this,IOStream *stream,aiNode **onode,aiNode *parent)

{
  char *pcVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ai_uint32 aVar8;
  aiNode *this_00;
  uint *puVar9;
  aiNode **ppaVar10;
  aiMetadata *paVar11;
  aiString *paVar12;
  aiMetadataEntry *__s;
  double dVar13;
  aiString *paVar14;
  runtime_error *this_01;
  ulong uVar15;
  uint i;
  ulong uVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  float local_438;
  undefined4 uStack_434;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  
  uVar4 = Read<unsigned_int>(stream);
  if (uVar4 != 0x123c) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    _local_438 = (undefined1 *)&stack0xfffffffffffffbd8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffbc8,"Magic chunk identifiers are wrong!","");
    std::runtime_error::runtime_error(this_01,(string *)&stack0xfffffffffffffbc8);
    *(undefined ***)this_01 = &PTR__runtime_error_00900168;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  Read<unsigned_int>(stream);
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  Read<aiString>((aiString *)&stack0xfffffffffffffbc8,stream);
  if (this_00 != (aiNode *)&stack0xfffffffffffffbc8) {
    uVar16 = (ulong)_local_438 & 0xffffffff;
    (this_00->mName).length = (ai_uint32)local_438;
    memcpy((this_00->mName).data,&stack0xfffffffffffffbcc,uVar16);
    (this_00->mName).data[uVar16] = '\0';
  }
  Read<aiMatrix4x4t<float>>((aiMatrix4x4 *)&stack0xfffffffffffffbc8,stream);
  *(undefined8 *)&(this_00->mTransformation).d1 = local_408;
  *(undefined8 *)&(this_00->mTransformation).d3 = uStack_400;
  *(undefined8 *)&(this_00->mTransformation).c1 = local_418;
  *(undefined8 *)&(this_00->mTransformation).c3 = uStack_410;
  *(undefined8 *)&(this_00->mTransformation).b1 = local_428;
  *(undefined8 *)&(this_00->mTransformation).b3 = uStack_420;
  (this_00->mTransformation).a1 = local_438;
  (this_00->mTransformation).a2 = (float)uStack_434;
  *(undefined8 *)&(this_00->mTransformation).a3 = uStack_430;
  uVar4 = Read<unsigned_int>(stream);
  uVar5 = Read<unsigned_int>(stream);
  uVar6 = Read<unsigned_int>(stream);
  if (parent != (aiNode *)0x0) {
    this_00->mParent = parent;
  }
  if (uVar5 != 0) {
    puVar9 = (uint *)operator_new__((ulong)uVar5 * 4);
    this_00->mMeshes = puVar9;
    uVar16 = 0;
    do {
      uVar7 = Read<unsigned_int>(stream);
      this_00->mMeshes[uVar16] = uVar7;
      this_00->mNumMeshes = this_00->mNumMeshes + 1;
      uVar16 = uVar16 + 1;
    } while (uVar5 != uVar16);
  }
  if (uVar4 != 0) {
    ppaVar10 = (aiNode **)operator_new__((ulong)uVar4 * 8);
    this_00->mChildren = ppaVar10;
    lVar17 = 0;
    do {
      ReadBinaryNode(this,stream,(aiNode **)((long)this_00->mChildren + lVar17),this_00);
      this_00->mNumChildren = this_00->mNumChildren + 1;
      lVar17 = lVar17 + 8;
    } while ((ulong)uVar4 << 3 != lVar17);
  }
  if (uVar6 != 0) {
    paVar11 = (aiMetadata *)operator_new(0x18);
    paVar11->mKeys = (aiString *)0x0;
    paVar11->mValues = (aiMetadataEntry *)0x0;
    paVar11->mNumProperties = uVar6;
    uVar16 = (ulong)uVar6;
    paVar12 = (aiString *)operator_new__(uVar16 * 0x404);
    paVar14 = paVar12;
    do {
      paVar14->length = 0;
      paVar14->data[0] = '\0';
      memset(paVar14->data + 1,0x1b,0x3ff);
      paVar14 = paVar14 + 1;
    } while (paVar14 != paVar12 + uVar16);
    paVar11->mKeys = paVar12;
    uVar15 = (ulong)paVar11->mNumProperties << 4;
    __s = (aiMetadataEntry *)operator_new__(uVar15);
    lVar17 = 0;
    memset(__s,0,uVar15);
    paVar11->mValues = __s;
    this_00->mMetaData = paVar11;
    lVar18 = 8;
    do {
      Read<aiString>((aiString *)&stack0xfffffffffffffbc8,stream);
      paVar12 = this_00->mMetaData->mKeys;
      paVar14 = (aiString *)(paVar12->data + lVar17 + -4);
      if (paVar14 != (aiString *)&stack0xfffffffffffffbc8) {
        uVar15 = (ulong)_local_438 & 0xffffffff;
        pcVar1 = paVar12->data + lVar17 + -4;
        *(float *)pcVar1 = local_438;
        memcpy(pcVar1 + 4,&stack0xfffffffffffffbcc,uVar15);
        paVar14->data[uVar15] = '\0';
      }
      uVar3 = Read<unsigned_short>(stream);
      *(uint *)((long)this_00->mMetaData->mValues + lVar18 + -8) = (uint)uVar3;
      switch(*(undefined4 *)((long)this_00->mMetaData->mValues + lVar18 + -8)) {
      case 0:
        paVar14 = (aiString *)operator_new(1);
        bVar2 = Read<bool>(stream);
        *(bool *)&paVar14->length = bVar2;
        break;
      case 1:
        paVar14 = (aiString *)operator_new(4);
        aVar8 = Read<int>(stream);
        paVar14->length = aVar8;
        break;
      case 2:
        paVar14 = (aiString *)operator_new(8);
        dVar13 = (double)Read<unsigned_long>(stream);
        *(double *)paVar14 = dVar13;
        break;
      case 3:
        paVar14 = (aiString *)operator_new(4);
        fVar19 = Read<float>(stream);
        paVar14->length = (ai_uint32)fVar19;
        break;
      case 4:
        paVar14 = (aiString *)operator_new(8);
        dVar13 = Read<double>(stream);
        *(double *)paVar14 = dVar13;
        break;
      case 5:
        paVar14 = (aiString *)operator_new(0x404);
        Read<aiString>(paVar14,stream);
        break;
      case 6:
        paVar14 = (aiString *)operator_new(0xc);
        fVar19 = Read<float>(stream);
        fVar20 = Read<float>(stream);
        fVar21 = Read<float>(stream);
        *(ulong *)paVar14 = CONCAT44(fVar20,fVar19);
        *(float *)(paVar14->data + 4) = fVar21;
        break;
      default:
        paVar14 = (aiString *)0x0;
      }
      *(aiString **)((long)&this_00->mMetaData->mValues->mType + lVar18) = paVar14;
      lVar17 = lVar17 + 0x404;
      lVar18 = lVar18 + 0x10;
    } while (uVar16 * 0x404 != lVar17);
  }
  *onode = this_00;
  return;
}

Assistant:

void AssbinImporter::ReadBinaryNode( IOStream * stream, aiNode** onode, aiNode* parent ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AINODE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    std::unique_ptr<aiNode> node(new aiNode());

    node->mName = Read<aiString>(stream);
    node->mTransformation = Read<aiMatrix4x4>(stream);
    unsigned numChildren = Read<unsigned int>(stream);
    unsigned numMeshes = Read<unsigned int>(stream);
	unsigned int nb_metadata = Read<unsigned int>(stream);

    if(parent) {
        node->mParent = parent;
    }

    if (numMeshes)
    {
        node->mMeshes = new unsigned int[numMeshes];
        for (unsigned int i = 0; i < numMeshes; ++i) {
            node->mMeshes[i] = Read<unsigned int>(stream);
            node->mNumMeshes++;
        }
    }

    if (numChildren) {
        node->mChildren = new aiNode*[numChildren];
        for (unsigned int i = 0; i < numChildren; ++i) {
            ReadBinaryNode( stream, &node->mChildren[i], node.get() );
            node->mNumChildren++;
        }
    }

    if ( nb_metadata > 0 ) {
        node->mMetaData = aiMetadata::Alloc(nb_metadata);
        for (unsigned int i = 0; i < nb_metadata; ++i) {
            node->mMetaData->mKeys[i] = Read<aiString>(stream);
            node->mMetaData->mValues[i].mType = (aiMetadataType) Read<uint16_t>(stream);
            void* data = nullptr;

            switch (node->mMetaData->mValues[i].mType) {
                case AI_BOOL:
                    data = new bool(Read<bool>(stream));
                    break;
                case AI_INT32:
                    data = new int32_t(Read<int32_t>(stream));
                    break;
                case AI_UINT64:
                    data = new uint64_t(Read<uint64_t>(stream));
                    break;
                case AI_FLOAT:
                    data = new float(Read<float>(stream));
                    break;
                case AI_DOUBLE:
                    data = new double(Read<double>(stream));
                    break;
                case AI_AISTRING:
                    data = new aiString(Read<aiString>(stream));
                    break;
                case AI_AIVECTOR3D:
                    data = new aiVector3D(Read<aiVector3D>(stream));
                    break;
#ifndef SWIG
                case FORCE_32BIT:
#endif // SWIG
                default:
                    break;
            }

			node->mMetaData->mValues[i].mData = data;
		}
	}
    *onode = node.release();
}